

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rbtree.c
# Opt level: O0

void test_walk_backward(void)

{
  int iVar1;
  RBTREE_NODE *tree_00;
  RBTREE_NODE *pRVar2;
  RBTREE_CURSOR *pRVar3;
  RBTREE_NODE *node;
  RBTREE_CURSOR cur;
  int *values;
  char *name;
  VAL key;
  VAL *val;
  int i;
  int vec;
  RBTREE tree;
  RBTREE_CURSOR *in_stack_fffffffffffffb98;
  RBTREE_NODE *in_stack_fffffffffffffba0;
  RBTREE_CURSOR *in_stack_fffffffffffffba8;
  RBTREE_NODE *in_stack_ffffffffffffffa8;
  RBTREE_NODE *in_stack_ffffffffffffffb0;
  RBTREE *in_stack_ffffffffffffffb8;
  int local_10;
  uint local_c;
  undefined1 local_8 [8];
  
  memset(local_8,0,8);
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    acutest_case_("%s",test_walk_backward::vectors[(int)local_c].name);
    for (local_10 = 0; local_10 < 0xf; local_10 = local_10 + 1) {
      make_val((int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      iVar1 = rbtree_insert(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                            (RBTREE_CMP_FUNC)in_stack_ffffffffffffffa8);
      acutest_check_((int)(ulong)(iVar1 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                     ,0x143,"%s","rbtree_insert(&tree, make_val(values[i]), val_cmp) == 0");
    }
    iVar1 = rbtree_verify((RBTREE *)in_stack_fffffffffffffb98);
    acutest_check_((int)(ulong)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x144,"%s","rbtree_verify(&tree) == 0");
    tree_00 = rbtree_tail((RBTREE *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    local_10 = 0xf;
    while (tree_00 != (RBTREE_NODE *)0x0) {
      acutest_check_((int)(ulong)(*(int *)&tree_00[-1].r == local_10),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                     ,0x14d,"%s","val->x == i");
      tree_00 = rbtree_prev(in_stack_fffffffffffffba8);
      local_10 = local_10 + -1;
    }
    pRVar2 = rbtree_prev(in_stack_fffffffffffffba8);
    acutest_check_((int)(ulong)(pRVar2 == (RBTREE_NODE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x151,"%s","rbtree_prev(&cur) == NULL");
    in_stack_fffffffffffffba0 = rbtree_current((RBTREE_CURSOR *)&stack0xfffffffffffffbb8);
    pRVar2 = rbtree_lookup((RBTREE *)tree_00,(RBTREE_NODE *)in_stack_fffffffffffffba8,
                           (RBTREE_CMP_FUNC)in_stack_fffffffffffffba0);
    acutest_check_((int)(ulong)(in_stack_fffffffffffffba0 == pRVar2),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x155,"%s",
                   "rbtree_current(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp)");
    in_stack_fffffffffffffba8 = (RBTREE_CURSOR *)rbtree_next(in_stack_fffffffffffffba8);
    pRVar3 = (RBTREE_CURSOR *)
             rbtree_lookup((RBTREE *)tree_00,(RBTREE_NODE *)in_stack_fffffffffffffba8,
                           (RBTREE_CMP_FUNC)in_stack_fffffffffffffba0);
    acutest_check_((int)(ulong)(in_stack_fffffffffffffba8 == pRVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x157,"%s","rbtree_next(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp)");
    clear_tree((RBTREE *)in_stack_fffffffffffffba0);
  }
  return;
}

Assistant:

static void
test_walk_backward(void)
{
    static const struct {
        const char* name;
        int values[15];
    } vectors[] = {
        { "Ascending order",    { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 } },
        { "Descending order",   { 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1 } },
        { "Randomized order",   { 8, 1, 12, 6, 4, 14, 11, 9, 10, 15, 2, 13, 3, 5, 7 } }
    };

    RBTREE tree = RBTREE_INITIALIZER;
    int vec, i;
    VAL* val;
    VAL key;

    for(vec = 0; vec < sizeof(vectors) / sizeof(vectors[0]); vec++) {
        const char* name = vectors[vec].name;
        const int* values = vectors[vec].values;
        RBTREE_CURSOR cur;
        RBTREE_NODE* node;

        TEST_CASE(name);

        for(i = 0; i < 15; i++)
            TEST_CHECK(rbtree_insert(&tree, make_val(values[i]), val_cmp) == 0);
        TEST_CHECK(rbtree_verify(&tree) == 0);

        /* Verify the cur visits all the nodes and that it happens in the
         * right order. */
        for(node = rbtree_tail(&tree, &cur), i = 15;
            node != NULL;
            node = rbtree_prev(&cur), i--)
        {
            val = RBTREE_DATA(node, VAL, the_node);
            TEST_CHECK(val->x == i);
        }

        /* Verify any other attempt to go forward still returns NULL. */
        TEST_CHECK(rbtree_prev(&cur) == NULL);

        /* Verify we still point to the first node and user can walk forward again. */
        key.x = 1;
        TEST_CHECK(rbtree_current(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp));
        key.x = 2;
        TEST_CHECK(rbtree_next(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp));

        clear_tree(&tree);
    }
}